

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O2

string * __thiscall cinatra::uri_t::get_path_abi_cxx11_(string *__return_storage_ptr__,uri_t *this)

{
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((this->path)._M_len == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"/",&local_9);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&this->path,&local_a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_path() const {
    if (path.empty())
      return "/";

    return std::string(path);
  }